

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o1.cc
# Opt level: O0

bool lf::geometry::assertNonDegenerateTriangle(Matrix<double,__1,_3,_0,__1,_3> *coords,double tol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Index IVar8;
  runtime_error *prVar9;
  CoeffReturnType pdVar10;
  ostream *poVar11;
  allocator<char> local_1181;
  string local_1180;
  allocator<char> local_1159;
  string local_1158;
  allocator<char> local_1131;
  string local_1130;
  string local_1110;
  allocator<char> local_10e9;
  string local_10e8;
  allocator<char> local_10c1;
  string local_10c0;
  stringstream local_10a0 [8];
  stringstream ss_5;
  ostream local_1090 [376];
  string local_f18;
  allocator<char> local_ef1;
  string local_ef0;
  allocator<char> local_ec9;
  string local_ec8;
  stringstream local_ea8 [8];
  stringstream ss_4;
  ostream local_e98 [376];
  ConstColXpr local_d20;
  ConstColXpr local_cf0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
  local_cc0;
  ConstColXpr local_c58;
  ConstColXpr local_c28;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
  local_bf8;
  type local_b90;
  RealScalar local_b78;
  double area_1;
  Matrix<double,3,3,0,3,3> local_b40 [8];
  Matrix<double,_3,_3,_0,_3,_3> c3d;
  allocator<char> local_ad1;
  string local_ad0;
  allocator<char> local_aa9;
  string local_aa8;
  stringstream local_a88 [8];
  stringstream ss_3;
  ostream local_a78 [376];
  double local_900;
  double area;
  allocator<char> local_8d1;
  string local_8d0;
  allocator<char> local_8a9;
  string local_8a8;
  stringstream local_888 [8];
  stringstream ss_2;
  ostream local_878 [376];
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  allocator<char> local_6b1;
  string local_6b0;
  stringstream local_690 [8];
  stringstream ss_1;
  ostream local_680 [376];
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  stringstream local_488 [8];
  stringstream ss;
  ostream local_478 [376];
  double local_300;
  double circum;
  ConstColXpr local_2c0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
  local_288;
  RealScalar local_210;
  double e2lensq;
  ConstColXpr local_1d0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
  local_198;
  RealScalar local_120;
  double e1lensq;
  ConstColXpr local_e0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
  local_a8;
  RealScalar local_30;
  double e0lensq;
  double dStack_20;
  dim_t wd;
  double tol_local;
  Matrix<double,__1,_3,_0,__1,_3> *coords_local;
  
  dStack_20 = tol;
  tol_local = (double)coords;
  IVar8 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::rows
                    (&coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>);
  e0lensq._4_4_ = (uint)IVar8;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            (&local_e0,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)tol_local,1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            ((ConstColXpr *)&e1lensq,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)tol_local
             ,0);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>const,-1,1,true>>::operator-
            (&local_a8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>const,_1,1,true>> *)&local_e0
             ,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
               *)&e1lensq);
  local_30 = Eigen::
             MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>_>
             ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
                            *)&local_a8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            (&local_1d0,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)tol_local,2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            ((ConstColXpr *)&e2lensq,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)tol_local
             ,1);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>const,-1,1,true>>::operator-
            (&local_198,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>const,_1,1,true>> *)
             &local_1d0,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_> *
             )&e2lensq);
  local_120 = Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>_>
              ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
                             *)&local_198);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            (&local_2c0,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)tol_local,0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            ((ConstColXpr *)&circum,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)tol_local,
             2);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>const,-1,1,true>>::operator-
            (&local_288,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>const,_1,1,true>> *)
             &local_2c0,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_> *
             )&circum);
  local_210 = Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>_>
              ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
                             *)&local_288);
  local_300 = local_30 + local_120 + local_210;
  if (local_30 <= dStack_20 * local_300) {
    std::__cxx11::stringstream::stringstream(local_488);
    std::operator<<(local_478,"Collapsed edge 0");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b8,"e0lensq > tol * circum",&local_4b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
               ,&local_4e1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_4b8,&local_4e0,0x14,&local_508);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::allocator<char>::~allocator(&local_4e1);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_120 <= dStack_20 * local_300) {
    std::__cxx11::stringstream::stringstream(local_690);
    std::operator<<(local_680,"Collapsed edge 1");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6b0,"e1lensq > tol * circum",&local_6b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
               ,&local_6d9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_6b0,&local_6d8,0x15,&local_700);
    std::__cxx11::string::~string((string *)&local_700);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::allocator<char>::~allocator(&local_6d9);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::allocator<char>::~allocator(&local_6b1);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_210 <= dStack_20 * local_300) {
    std::__cxx11::stringstream::stringstream(local_888);
    std::operator<<(local_878,"Collapsed edge 2");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8a8,"e2lensq > tol * circum",&local_8a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8d0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
               ,&local_8d1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_8a8,&local_8d0,0x16,(string *)&area);
    std::__cxx11::string::~string((string *)&area);
    std::__cxx11::string::~string((string *)&local_8d0);
    std::allocator<char>::~allocator(&local_8d1);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::allocator<char>::~allocator(&local_8a9);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (e0lensq._4_4_ == 2) {
    pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_0> *)tol_local,0,1
                        );
    dVar1 = *pdVar10;
    pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_0> *)tol_local,0,0
                        );
    dVar2 = *pdVar10;
    pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_0> *)tol_local,1,2
                        );
    dVar3 = *pdVar10;
    pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_0> *)tol_local,1,0
                        );
    dVar4 = *pdVar10;
    pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_0> *)tol_local,1,1
                        );
    dVar5 = *pdVar10;
    pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_0> *)tol_local,1,0
                        );
    dVar6 = *pdVar10;
    pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_0> *)tol_local,0,2
                        );
    dVar7 = *pdVar10;
    pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_0> *)tol_local,0,0
                        );
    local_900 = ABS((dVar1 - dVar2) * (dVar3 - dVar4) + -((dVar5 - dVar6) * (dVar7 - *pdVar10)));
    if (local_900 <= dStack_20 * local_300) {
      std::__cxx11::stringstream::stringstream(local_a88);
      poVar11 = std::operator<<(local_a78,"Degenerate 2D triangle, geo = ");
      Eigen::operator<<(poVar11,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)tol_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_aa8,"area > tol * circum",&local_aa9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ad0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
                 ,&local_ad1);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed
                (&local_aa8,&local_ad0,0x1e,
                 (string *)
                 (c3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 8));
      std::__cxx11::string::~string
                ((string *)
                 (c3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 8));
      std::__cxx11::string::~string((string *)&local_ad0);
      std::allocator<char>::~allocator(&local_ad1);
      std::__cxx11::string::~string((string *)&local_aa8);
      std::allocator<char>::~allocator(&local_aa9);
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"this code should not be reached");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (e0lensq._4_4_ != 3) {
      std::__cxx11::stringstream::stringstream(local_10a0);
      poVar11 = std::operator<<(local_1090,"Illegal world dimension");
      std::ostream::operator<<(poVar11,e0lensq._4_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_10c0,"false",&local_10c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_10e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
                 ,&local_10e9);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_10c0,&local_10e8,0x2b,&local_1110);
      std::__cxx11::string::~string((string *)&local_1110);
      std::__cxx11::string::~string((string *)&local_10e8);
      std::allocator<char>::~allocator(&local_10e9);
      std::__cxx11::string::~string((string *)&local_10c0);
      std::allocator<char>::~allocator(&local_10c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1130,"false",&local_1131);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1158,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
                 ,&local_1159);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1180,"",&local_1181);
      lf::base::AssertionFailed(&local_1130,&local_1158,0x2b,&local_1180);
      std::__cxx11::string::~string((string *)&local_1180);
      std::allocator<char>::~allocator(&local_1181);
      std::__cxx11::string::~string((string *)&local_1158);
      std::allocator<char>::~allocator(&local_1159);
      std::__cxx11::string::~string((string *)&local_1130);
      std::allocator<char>::~allocator(&local_1131);
      abort();
    }
    Eigen::DenseBase<Eigen::Matrix<double,-1,3,0,-1,3>>::block<3,3>
              ((Type *)&area_1,(DenseBase<Eigen::Matrix<double,_1,3,0,_1,3>> *)tol_local,0,0);
    Eigen::Matrix<double,3,3,0,3,3>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>const,3,3,false>>
              (local_b40,(Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,_3,_3,_false> *)&area_1
              );
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_c28,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_b40,1);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_c58,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_b40,0);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>>::operator-
              (&local_bf8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>> *)&local_c28
               ,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *
                )&local_c58);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_cf0,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_b40,2);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_d20,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_b40,0);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>>::operator-
              (&local_cc0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>> *)&local_cf0
               ,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *
                )&local_d20);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>const>>
    ::
    cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>const>>
              (&local_b90,&local_bf8,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                *)&local_cc0);
    local_b78 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_b90);
    if (local_b78 <= dStack_20 * local_300) {
      std::__cxx11::stringstream::stringstream(local_ea8);
      std::operator<<(local_e98,"Degenerate 3D triangle");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ec8,"area > tol * circum",&local_ec9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ef0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
                 ,&local_ef1);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_ec8,&local_ef0,0x26,&local_f18);
      std::__cxx11::string::~string((string *)&local_f18);
      std::__cxx11::string::~string((string *)&local_ef0);
      std::allocator<char>::~allocator(&local_ef1);
      std::__cxx11::string::~string((string *)&local_ec8);
      std::allocator<char>::~allocator(&local_ec9);
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"this code should not be reached");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return true;
}

Assistant:

bool assertNonDegenerateTriangle(
    const Eigen::Matrix<double, Eigen::Dynamic, 3>& coords, double tol) {
  // World dimension
  const Geometry::dim_t wd = coords.rows();
  // Length tests
  const double e0lensq = (coords.col(1) - coords.col(0)).squaredNorm();
  const double e1lensq = (coords.col(2) - coords.col(1)).squaredNorm();
  const double e2lensq = (coords.col(0) - coords.col(2)).squaredNorm();
  // Test lengths of edges versus circumference.
  const double circum = e0lensq + e1lensq + e2lensq;
  LF_VERIFY_MSG(e0lensq > tol * circum, "Collapsed edge 0");
  LF_VERIFY_MSG(e1lensq > tol * circum, "Collapsed edge 1");
  LF_VERIFY_MSG(e2lensq > tol * circum, "Collapsed edge 2");
  // Area test
  switch (wd) {
    case 2: {
      const double area = std::fabs(
          ((coords(0, 1) - coords(0, 0)) * (coords(1, 2) - coords(1, 0)) -
           (coords(1, 1) - coords(1, 0)) * (coords(0, 2) - coords(0, 0))));
      LF_VERIFY_MSG(area > tol * circum,
                    "Degenerate 2D triangle, geo = " << coords);
      return true;
      break;
    }
    case 3: {
      const Eigen::Matrix<double, 3, 3> c3d(coords.block<3, 3>(0, 0));
      const double area =
          ((c3d.col(1) - c3d.col(0)).cross(c3d.col(2) - c3d.col(0))).norm();
      LF_VERIFY_MSG(area > tol * circum, "Degenerate 3D triangle");
      return true;
      break;
    }
    default: {
      LF_ASSERT_MSG(false, "Illegal world dimension" << wd);
      break;
    }
  }
  return false;
}